

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [8];
  pointer pfVar4;
  byte bVar5;
  Error EVar6;
  OptionAdder *pOVar7;
  size_t sVar8;
  OptionValue *pOVar9;
  size_t sVar10;
  FILE *pFVar11;
  size_type sVar12;
  ostream *poVar13;
  byte bVar14;
  int iVar15;
  char cVar16;
  long *plVar17;
  ulong uVar18;
  int iVar19;
  char *pcVar20;
  _Head_base<0UL,_wave::File::Impl_*,_false> *this;
  uint uVar21;
  uint uVar22;
  uint *puVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_00;
  File read_file;
  string name;
  string output_file;
  string input_file;
  ParseResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Options options;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_828;
  undefined1 local_818 [32];
  _Alloc_hider local_7f8;
  size_type sStack_7f0;
  undefined1 local_7e8 [16];
  _Alloc_hider _Stack_7d8;
  __node_base local_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_7c8;
  size_t sStack_7b8;
  element_type *local_7b0 [2];
  undefined4 local_79c;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  uint *local_698;
  uint *local_690;
  uint local_688;
  undefined4 uStack_684;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  _Head_base<0UL,_wave::File::Impl_*,_false> local_678;
  long local_670;
  undefined1 local_668 [16];
  string local_658;
  string local_638;
  undefined1 local_618 [20];
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_5e0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_5a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_590;
  element_type *local_578;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_570;
  element_type *local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_560;
  element_type *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_550;
  element_type *local_548;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_540;
  element_type *local_538;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_530;
  element_type *local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_520;
  element_type *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_510;
  element_type *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_500;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  shared_ptr<const_cxxopts::Value> local_378;
  shared_ptr<const_cxxopts::Value> local_368;
  shared_ptr<const_cxxopts::Value> local_358;
  shared_ptr<const_cxxopts::Value> local_348;
  shared_ptr<const_cxxopts::Value> local_338;
  shared_ptr<const_cxxopts::Value> local_328;
  shared_ptr<const_cxxopts::Value> local_318;
  shared_ptr<const_cxxopts::Value> local_308;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  undefined1 local_238 [8];
  pointer pfStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  uint auStack_218 [16];
  string local_1d8 [32];
  bool local_1b8;
  bool local_1b7;
  Impl *local_1b0;
  char acStack_1a0 [368];
  
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  local_638._M_string_length = 0;
  local_638.field_2._M_local_buf[0] = '\0';
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  local_658._M_string_length = 0;
  local_658.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_678,*argv,(allocator *)local_238);
  std::__cxx11::string::string
            ((string *)&local_278,(char *)local_678._M_head_impl,(allocator *)local_848);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4f8,local_678._M_head_impl,
             &(local_678._M_head_impl)->istream + local_670);
  std::__cxx11::string::append((char *)&local_4f8);
  cxxopts::Options::Options((Options *)local_238,&local_278,&local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"[optional args]","");
  std::__cxx11::string::operator=((string *)(local_238 + 0x60),(string *)local_258);
  local_1b8 = true;
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  local_1b7 = true;
  local_698 = &local_688;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"");
  uVar21 = local_688;
  local_838._0_8_ = local_690;
  puVar23 = (uint *)(local_618 + 0x10);
  if (local_698 == &local_688) {
    uStack_600 = uStack_680;
    uStack_5fc = uStack_67c;
    local_618._0_8_ = puVar23;
  }
  else {
    local_618._0_8_ = local_698;
  }
  uStack_604 = uStack_684;
  local_618._16_4_ = local_688;
  local_618._8_8_ = local_690;
  local_690 = (uint *)0x0;
  local_688 = local_688 & 0xffffff00;
  local_848._8_8_ = local_838 + 8;
  if ((uint *)local_618._0_8_ == puVar23) {
    local_838._8_8_ = CONCAT44(uStack_684,uVar21);
    aStack_828._4_4_ = uStack_5fc;
    aStack_828._0_4_ = uStack_600;
  }
  else {
    local_848._8_8_ = local_618._0_8_;
    local_838._8_8_ = stack0xfffffffffffff9f8;
  }
  local_848._0_8_ = (Impl *)local_238;
  local_698 = &local_688;
  local_618._0_8_ = puVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"i,input","");
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"Input","");
  cxxopts::value<std::__cxx11::string>();
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_508;
  local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_500;
  local_508 = (element_type *)0x0;
  p_Stack_500 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"");
  pOVar7 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_848,(string *)local_618,&local_798,&local_308,&local_398)
  ;
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"o,output","");
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"Output file","");
  cxxopts::value<std::__cxx11::string>();
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_518;
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_510;
  local_518 = (element_type *)0x0;
  p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_6b8,&local_6d8,&local_318,&local_3b8);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"tap","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"Convert WAV to TAP","");
  cxxopts::value<bool>();
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_528;
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_520;
  local_528 = (element_type *)0x0;
  p_Stack_520 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_6f8,&local_718,&local_328,&local_3d8);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"oldtap","");
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"Convert WAV to oldTAP","");
  cxxopts::value<bool>();
  local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_538;
  local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_530;
  local_538 = (element_type *)0x0;
  p_Stack_530 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_738,&local_758,&local_338,&local_3f8);
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"wav","");
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Convert TAP to WAV","");
  cxxopts::value<bool>();
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_548;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_540;
  local_548 = (element_type *)0x0;
  p_Stack_540 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_778,&local_418,&local_348,&local_438);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"old2new","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_478,"Convert old TAP to new TAP","");
  cxxopts::value<bool>();
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_558;
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_550;
  local_558 = (element_type *)0x0;
  p_Stack_550 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_458,&local_478,&local_358,&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"new2old","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,"Convert new TAP to old TAP <WARNING: header will not be good>",""
            );
  cxxopts::value<bool>();
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_568;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_560;
  local_568 = (element_type *)0x0;
  p_Stack_560 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
  pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_4b8,&local_298,&local_368,&local_4d8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"help","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Print help","");
  cxxopts::value<bool>();
  local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_578;
  local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_570;
  local_578 = (element_type *)0x0;
  p_Stack_570 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  cxxopts::OptionAdder::operator()(pOVar7,&local_2b8,&local_2d8,&local_378,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_570 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_570);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_560);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_550);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_540 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_540);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if (local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_530);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if (local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_520);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_510);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if (local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_500 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_500);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_618._0_8_ != local_618 + 0x10) {
    operator_delete((void *)local_618._0_8_,stack0xfffffffffffff9f8 + 1);
  }
  if ((undefined1 *)local_848._8_8_ != local_838 + 8) {
    operator_delete((void *)local_848._8_8_,local_838._8_8_ + 1);
  }
  if (local_698 != &local_688) {
    operator_delete(local_698,CONCAT44(uStack_684,local_688) + 1);
  }
  local_848._0_8_ = local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"input","");
  plVar17 = (long *)local_818;
  aStack_828._M_allocated_capacity = (size_type)plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_828,"output","");
  options_00._M_len = 2;
  options_00._M_array = (iterator)local_848;
  cxxopts::Options::parse_positional((Options *)local_238,options_00);
  lVar24 = -0x40;
  do {
    if (plVar17 != (long *)plVar17[-2]) {
      operator_delete((long *)plVar17[-2],*plVar17 + 1);
    }
    plVar17 = plVar17 + -4;
    lVar24 = lVar24 + 0x20;
  } while (lVar24 != 0);
  local_848._8_8_ = acStack_1a0;
  local_818._0_8_ = local_7e8;
  local_848._0_8_ = local_1b0;
  local_838._0_8_ = (pointer)0x0;
  local_838._8_8_ = 0;
  aStack_828._0_8_ = 0;
  aStack_828._M_local_buf[8] = local_1b7;
  local_818._8_8_ = 1;
  local_818._16_8_ = 0;
  local_818._24_8_ = 0;
  local_7f8._M_p = (pointer)0x3f800000;
  local_7e8._8_8_ = local_7b0;
  sStack_7f0 = 0;
  local_7e8._0_8_ = 0;
  _Stack_7d8._M_p = (pointer)0x1;
  local_7d0._M_nxt = (_Hash_node_base *)0x0;
  aStack_7c8._M_allocated_capacity = 0;
  aStack_7c8._8_8_ = 0x3f800000;
  sStack_7b8 = 0;
  local_7b0[0] = (element_type *)0x0;
  cxxopts::OptionParser::parse((ParseResult *)local_618,(OptionParser *)local_848,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_7e8 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_818);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_838);
  local_848._0_8_ = (Impl *)local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"help","");
  sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
  if (sVar8 != 0) {
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
LAB_00108da0:
    local_798._M_dataplus._M_p = (pointer)0x0;
    local_798._M_string_length = 0;
    local_798.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_848,(Options *)local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_798);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_848._0_8_,local_848._8_8_);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::string::~string((string *)local_848);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_798);
    exit(0);
  }
  if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
    operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
  }
  if (local_5a8.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_5a8.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00108da0;
  local_848._0_8_ = (Impl *)local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"input","");
  sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
  if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
    operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
  }
  if (sVar8 == 0) {
    lVar24 = 0x18;
    pcVar20 = "Input file is mandatory.";
LAB_00107efe:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar20,lVar24);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    uVar21 = 1;
    local_79c = 0;
    bVar30 = false;
    bVar27 = false;
    bVar29 = false;
    bVar28 = false;
    bVar26 = false;
  }
  else {
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"input","");
    pOVar9 = cxxopts::ParseResult::operator[]((ParseResult *)local_618,(string *)local_848);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar9);
    std::__cxx11::string::_M_assign((string *)&local_638);
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"output","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    if (sVar8 == 0) {
      lVar24 = 0x19;
      pcVar20 = "Output file is mandatory.";
      goto LAB_00107efe;
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"output","");
    pOVar9 = cxxopts::ParseResult::operator[]((ParseResult *)local_618,(string *)local_848);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar9);
    std::__cxx11::string::_M_assign((string *)&local_658);
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"wav","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    if (sVar8 == 0) {
LAB_00107cb9:
      bVar26 = false;
      bVar28 = false;
LAB_00107cc1:
      bVar29 = false;
      bVar27 = false;
    }
    else {
      local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"tap","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_798);
      if (sVar10 == 0) goto LAB_00107cb9;
      local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"old2new","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_6b8);
      if (sVar10 == 0) {
        bVar28 = true;
        bVar26 = false;
        goto LAB_00107cc1;
      }
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"new2old","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_6d8);
      if (sVar10 == 0) {
        bVar26 = true;
        bVar28 = true;
        goto LAB_00107cc1;
      }
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"oldtap","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_6f8);
      bVar27 = sVar10 != 0;
      bVar26 = true;
      bVar29 = true;
      bVar28 = true;
    }
    if ((bVar29) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2)) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar26) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2)) {
      operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar28) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2)) {
      operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
    }
    if ((sVar8 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2)) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    if (bVar27) {
      lVar24 = 0x23;
      pcVar20 = "Only one target format is possible.";
      goto LAB_00107efe;
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"wav","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    if (sVar8 == 0) {
      local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"tap","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_718);
      if (sVar10 != 0) goto LAB_00107e21;
      local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"old2new","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_738);
      if (sVar10 != 0) {
        bVar26 = true;
        goto LAB_00107e24;
      }
      local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"new2old","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_758);
      if (sVar10 != 0) {
        bVar26 = true;
        bVar28 = true;
        goto LAB_00107e29;
      }
      local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"oldtap","");
      sVar10 = cxxopts::ParseResult::count((ParseResult *)local_618,&local_778);
      bVar27 = sVar10 == 0;
      bVar26 = true;
      bVar28 = true;
      bVar29 = true;
    }
    else {
LAB_00107e21:
      bVar26 = false;
LAB_00107e24:
      bVar28 = false;
LAB_00107e29:
      bVar29 = false;
      bVar27 = false;
    }
    if ((bVar29) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2)) {
      operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
    }
    if ((bVar28) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2)) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    if ((bVar26) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p != &local_738.field_2)) {
      operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
    }
    if ((sVar8 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p != &local_718.field_2)) {
      operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
    }
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    if (bVar27) {
      lVar24 = 0x1b;
      pcVar20 = "Target format is mandatory.";
      goto LAB_00107efe;
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"wav","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    bVar27 = sVar8 != 0;
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"tap","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    bVar28 = sVar8 != 0;
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"oldtap","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    bVar29 = sVar8 != 0;
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"old2new","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    bVar30 = sVar8 != 0;
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    local_848._0_8_ = (Impl *)local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"new2old","");
    sVar8 = cxxopts::ParseResult::count((ParseResult *)local_618,(string *)local_848);
    local_79c = (undefined4)CONCAT71((int7)(sVar8 >> 8),sVar8 != 0);
    if ((Impl *)local_848._0_8_ != (Impl *)local_838) {
      operator_delete((void *)local_848._0_8_,(ulong)(local_838._0_8_ + 1));
    }
    uVar21 = 0;
    bVar26 = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_590);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_5a8);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_5e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_618);
  cxxopts::Options::~Options((Options *)local_238);
  if (local_678._M_head_impl != (Impl *)local_668) {
    operator_delete(local_678._M_head_impl,local_668._0_8_ + 1);
  }
  if (!bVar26) goto LAB_00108c8a;
  if (bVar28) {
    wave::File::File((File *)local_848);
    local_238 = (undefined1  [8])0x0;
    pfStack_230 = (pointer)0x0;
    local_228._M_allocated_capacity = 0;
    EVar6 = wave::File::Open((File *)local_848,&local_638,kIn);
    if (EVar6 == kNoError) {
      EVar6 = wave::File::Read((File *)local_848,(vector<float,_std::allocator<float>_> *)local_238)
      ;
      if (EVar6 == kNoError) {
        pFVar11 = fopen(local_658._M_dataplus._M_p,"wb");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Converting Orao WAV tape to TAP format.",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        pfVar4 = pfStack_230;
        auVar3 = local_238;
        fputc(0x4f,pFVar11);
        if ((long)pfVar4 - (long)auVar3 == 0) {
          bVar5 = 0x4f;
          bVar14 = 0;
        }
        else {
          lVar24 = (long)pfVar4 - (long)auVar3 >> 2;
          bVar5 = 0x4f;
          lVar25 = 0;
          bVar14 = 0;
          bVar28 = false;
          bVar26 = false;
          iVar15 = 0;
          do {
            fVar1 = *(float *)((long)local_238 + lVar25 * 4);
            if (bVar26 == 0.0 < fVar1) {
              iVar19 = iVar15 + 1;
            }
            else {
              iVar19 = 0;
              if (bVar28) {
                bVar28 = false;
              }
              else {
                bVar5 = bVar5 * '\x02' | 10 < iVar15;
                if (bVar14 == 7) {
                  fputc((int)(char)bVar5,pFVar11);
                  bVar28 = true;
                  bVar5 = 0;
                  iVar19 = 0;
                  bVar14 = 0;
                }
                else {
                  bVar14 = bVar14 + 1;
                  bVar28 = true;
                }
              }
            }
            lVar25 = lVar25 + 1;
            bVar26 = 0.0 < fVar1;
            iVar15 = iVar19;
          } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
        }
        if (bVar14 != 0) {
          if (bVar14 < 7) {
            iVar15 = bVar14 - 7;
            do {
              bVar5 = bVar5 * '\x02';
              iVar15 = iVar15 + 1;
            } while (iVar15 != 0);
          }
LAB_00108c4d:
          fputc((int)(char)bVar5,pFVar11);
        }
LAB_00108c58:
        fclose(pFVar11);
        uVar21 = 0;
        goto LAB_00108c63;
      }
      cVar16 = 'h';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Something went wrong while reading input file.",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    }
    else {
      cVar16 = -0x58;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Something went wrong while opening input file.",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    }
    std::ostream::put(cVar16);
    uVar21 = 1;
    std::ostream::flush();
LAB_00108c63:
    if (local_238 != (undefined1  [8])0x0) {
      operator_delete((void *)local_238,local_228._M_allocated_capacity - (long)local_238);
    }
    this = (_Head_base<0UL,_wave::File::Impl_*,_false> *)local_848;
  }
  else {
    if (bVar29) {
      wave::File::File((File *)local_848);
      local_238 = (undefined1  [8])0x0;
      pfStack_230 = (pointer)0x0;
      local_228._M_allocated_capacity = 0;
      EVar6 = wave::File::Open((File *)local_848,&local_638,kIn);
      if (EVar6 == kNoError) {
        EVar6 = wave::File::Read((File *)local_848,
                                 (vector<float,_std::allocator<float>_> *)local_238);
        if (EVar6 == kNoError) {
          pFVar11 = fopen(local_658._M_dataplus._M_p,"wb");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Converting Orao WAV tape to old TAP format.",0x2b);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "WARNING: Header is not formed well, so some emulators may not work.",0x43);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          pfVar4 = pfStack_230;
          auVar3 = local_238;
          lVar24 = (long)pfStack_230 - (long)local_238;
          fputc(0x68,pFVar11);
          fputc(1,pFVar11);
          fputc(0,pFVar11);
          iVar15 = 0x165;
          do {
            fputc(0,pFVar11);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          if ((undefined1  [8])pfVar4 == auVar3) {
            uVar18 = 0;
            bVar14 = 0;
          }
          else {
            lVar24 = lVar24 >> 2;
            lVar25 = 0;
            bVar14 = 0;
            bVar28 = false;
            uVar18 = 0;
            bVar26 = false;
            iVar15 = 0;
            do {
              fVar1 = *(float *)((long)local_238 + lVar25 * 4);
              if (bVar26 == 0.0 < fVar1) {
                iVar19 = iVar15 + 1;
              }
              else {
                iVar19 = 0;
                if (bVar28) {
                  bVar28 = false;
                }
                else {
                  bVar5 = (10 < iVar15) << 7 | (byte)(uVar18 >> 1);
                  uVar18 = (ulong)bVar5;
                  if (bVar14 == 7) {
                    fputc((int)(char)bVar5,pFVar11);
                    bVar28 = true;
                    uVar18 = 0;
                    iVar19 = 0;
                    bVar14 = 0;
                  }
                  else {
                    bVar14 = bVar14 + 1;
                    bVar28 = true;
                  }
                }
              }
              lVar25 = lVar25 + 1;
              bVar26 = 0.0 < fVar1;
              iVar15 = iVar19;
            } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
          }
          bVar5 = (byte)uVar18;
          if (bVar14 != 0) {
            if (bVar14 < 7) {
              iVar15 = bVar14 - 7;
              do {
                uVar18 = uVar18 >> 1;
                bVar5 = (byte)uVar18;
                iVar15 = iVar15 + 1;
              } while (iVar15 != 0);
            }
            goto LAB_00108c4d;
          }
          goto LAB_00108c58;
        }
        cVar16 = 'h';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Something went wrong while reading input file.",0x2e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      }
      else {
        cVar16 = -0x58;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Something went wrong while opening input file.",0x2e);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      }
      std::ostream::put(cVar16);
      uVar21 = 1;
      std::ostream::flush();
      goto LAB_00108c63;
    }
    if (!bVar27) {
      if (bVar30) {
        std::ifstream::ifstream(local_238,(string *)&local_638,_S_bin);
        uVar22 = *(uint *)(local_238 + *(long *)((long)local_238 + -0x18) + 0x20);
        if ((uVar22 & 5) == 0) {
          local_848._0_8_ = (Impl *)0x0;
          local_848._8_8_ = (char *)0x0;
          local_838._0_8_ = (pointer)0x0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Converting Orao old TAP tape to new TAP format.",0x2f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::istream::seekg((long)local_238,_S_beg);
          sVar12 = std::istream::tellg();
          std::istream::seekg((long)local_238,_S_beg);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_848,sVar12);
          std::istream::read(local_238,local_848._0_8_);
          pFVar11 = fopen(local_658._M_dataplus._M_p,"wb");
          fputc(0x4f,pFVar11);
          if (0x168 < (ulong)(local_848._8_8_ - local_848._0_8_)) {
            uVar18 = 0x168;
            do {
              bVar14 = *(byte *)((long)&(((_Vector_impl *)&((string *)local_848._0_8_)->_M_dataplus)
                                        ->super__Vector_impl_data)._M_start + uVar18);
              bVar14 = bVar14 << 4 | bVar14 >> 4;
              bVar14 = bVar14 >> 2 & 0x33 | (bVar14 & 0x33) << 2;
              fputc((int)(char)(bVar14 >> 1 & 0x55 | (bVar14 & 0x55) * '\x02'),pFVar11);
              uVar18 = uVar18 + 1;
            } while (uVar18 < (ulong)(local_848._8_8_ - local_848._0_8_));
          }
          if ((Impl *)local_848._0_8_ != (Impl *)0x0) {
            operator_delete((void *)local_848._0_8_,local_838._0_8_ - local_848._0_8_);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to open input file",0x19);
          uVar21 = 1;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
        std::ifstream::~ifstream(local_238);
        if ((uVar22 & 5) != 0) goto LAB_00108c8a;
      }
      if ((char)local_79c != '\0') {
        std::ifstream::ifstream(local_238,(string *)&local_638,_S_bin);
        uVar22 = *(uint *)(local_238 + *(long *)((long)local_238 + -0x18) + 0x20);
        if ((uVar22 & 5) == 0) {
          local_848._0_8_ = (Impl *)0x0;
          local_848._8_8_ = (char *)0x0;
          local_838._0_8_ = (pointer)0x0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Converting Orao new TAP tape to old TAP format.",0x2f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "WARNING: Header is not formed well, so some emulators may not work.",0x43);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::istream::seekg((long)local_238,_S_beg);
          sVar12 = std::istream::tellg();
          std::istream::seekg((long)local_238,_S_beg);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_848,sVar12);
          std::istream::read(local_238,local_848._0_8_);
          pFVar11 = fopen(local_658._M_dataplus._M_p,"wb");
          fputc(0x68,pFVar11);
          fputc(1,pFVar11);
          fputc(0,pFVar11);
          iVar15 = 0x165;
          do {
            fputc(0,pFVar11);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          if (1 < (ulong)(local_848._8_8_ - local_848._0_8_)) {
            uVar18 = 1;
            do {
              bVar14 = *(byte *)((long)&(((_Vector_impl *)&((string *)local_848._0_8_)->_M_dataplus)
                                        ->super__Vector_impl_data)._M_start + uVar18);
              bVar14 = bVar14 << 4 | bVar14 >> 4;
              bVar14 = bVar14 >> 2 & 0x33 | (bVar14 & 0x33) << 2;
              fputc((int)(char)(bVar14 >> 1 & 0x55 | (bVar14 & 0x55) * '\x02'),pFVar11);
              uVar18 = uVar18 + 1;
            } while (uVar18 < (ulong)(local_848._8_8_ - local_848._0_8_));
          }
          if ((Impl *)local_848._0_8_ != (Impl *)0x0) {
            operator_delete((void *)local_848._0_8_,local_838._0_8_ - local_848._0_8_);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to open input file",0x19);
          uVar21 = 1;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
        std::ifstream::~ifstream(local_238);
        if ((uVar22 & 5) != 0) goto LAB_00108c8a;
      }
      uVar21 = 0;
      goto LAB_00108c8a;
    }
    wave::File::File((File *)&local_678);
    local_848._0_8_ = (Impl *)0x0;
    local_848._8_8_ = (char *)0x0;
    local_838._0_8_ = (pointer)0x0;
    EVar6 = wave::File::Open((File *)&local_678,&local_658,kOut);
    if (EVar6 == kNoError) {
      std::ifstream::ifstream(local_238,(string *)&local_638,_S_bin);
      if ((local_238[*(long *)((long)local_238 + -0x18) + 0x20] & 5) == 0) {
        local_618._0_8_ = (uint *)0x0;
        local_618._8_8_ = (uint *)0x0;
        stack0xfffffffffffff9f8 = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Converting Orao TAP tape to WAV format.",0x27);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::istream::seekg((long)local_238,_S_beg);
        lVar24 = std::istream::tellg();
        std::istream::seekg((long)local_238,_S_cur);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_618,lVar24 - 1);
        std::istream::read(local_238,local_618._0_8_);
        uVar2 = local_618._8_8_;
        if (local_618._0_8_ != local_618._8_8_) {
          puVar23 = (uint *)local_618._0_8_;
          do {
            uVar21 = *puVar23;
            uVar22 = 7;
            do {
              if (((byte)uVar21 >> (uVar22 & 0x1f) & 1) == 0) {
                iVar15 = 9;
                orao_output_wave((vector<float,_std::allocator<float>_> *)local_848,24576.0,9);
              }
              else {
                iVar15 = 0x11;
                orao_output_wave((vector<float,_std::allocator<float>_> *)local_848,24576.0,0x11);
              }
              orao_output_wave((vector<float,_std::allocator<float>_> *)local_848,-24576.0,iVar15);
              bVar26 = uVar22 != 0;
              uVar22 = uVar22 - 1;
            } while (bVar26);
            puVar23 = (uint *)((long)puVar23 + 1);
          } while (puVar23 != (uint *)uVar2);
        }
        EVar6 = wave::File::Write((File *)&local_678,
                                  (vector<float,_std::allocator<float>_> *)local_848);
        if (EVar6 != kNoError) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Something went wrong while writing output file.",0x2f);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        uVar21 = (uint)(EVar6 != kNoError);
        if ((uint *)local_618._0_8_ != (uint *)0x0) {
          operator_delete((void *)local_618._0_8_,stack0xfffffffffffff9f8 - local_618._0_8_);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to open input file",0x19);
        uVar21 = 1;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      std::ifstream::~ifstream(local_238);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Something went wrong while opening output file.",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      std::ostream::put(-0x58);
      uVar21 = 1;
      std::ostream::flush();
    }
    if ((Impl *)local_848._0_8_ != (Impl *)0x0) {
      operator_delete((void *)local_848._0_8_,local_838._0_8_ - local_848._0_8_);
    }
    this = &local_678;
  }
  wave::File::~File((File *)this);
LAB_00108c8a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,
                    CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                             local_658.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,
                    CONCAT71(local_638.field_2._M_allocated_capacity._1_7_,
                             local_638.field_2._M_local_buf[0]) + 1);
  }
  return uVar21;
}

Assistant:

int main(int argc, const char* argv[])
{
	std::string input_file;
	std::string output_file;
	bool wav_to_tap = false;
	bool wav_to_oldtap = false;
	bool tap_to_wav = false;
	bool old_to_new = false;
	bool new_to_old = false;
	try
	{
		std::string name = argv[0];
		cxxopts::Options options(name.c_str(), name + " - Orao cassette tape tool");
		options
			.positional_help("[optional args]")
			.show_positional_help();

		options
			.allow_unrecognised_options()
			.add_options()
			("i,input", "Input", cxxopts::value<std::string>())
			("o,output", "Output file", cxxopts::value<std::string>())
			("tap", "Convert WAV to TAP", cxxopts::value<bool>())
			("oldtap", "Convert WAV to oldTAP", cxxopts::value<bool>())
			("wav", "Convert TAP to WAV", cxxopts::value<bool>())
			("old2new", "Convert old TAP to new TAP", cxxopts::value<bool>())
			("new2old", "Convert new TAP to old TAP <WARNING: header will not be good>", cxxopts::value<bool>())
			("help", "Print help")
		;

		options.parse_positional({"input", "output"});

		auto result = options.parse(argc, argv);

		if (result.count("help") || result.arguments().empty())
		{
			std::cout << options.help() << std::endl;
			exit(0);
		}

		if (result.count("input"))
		{
			input_file = result["input"].as<std::string>();
		} else {
			std::cerr << "Input file is mandatory." << std::endl;
			return 1;
		}

		if (result.count("output"))
		{
			output_file = result["output"].as<std::string>();
		} else {
			std::cerr << "Output file is mandatory." << std::endl;	
			return 1;
		}

		if (result.count("wav") && result.count("tap") && result.count("old2new") && result.count("new2old") && result.count("oldtap"))
		{
			std::cerr << "Only one target format is possible." << std::endl;	
			return 1;
		}
		if (!result.count("wav") && !result.count("tap") && !result.count("old2new") && !result.count("new2old") && !result.count("oldtap"))
		{
			std::cerr << "Target format is mandatory." << std::endl;	
			return 1;
		}
		if (result.count("wav")) tap_to_wav = true;
		if (result.count("tap")) wav_to_tap = true;
		if (result.count("oldtap")) wav_to_oldtap = true;
		if (result.count("old2new")) old_to_new = true;
		if (result.count("new2old")) new_to_old = true;

	}
	catch (const cxxopts::OptionException& e)
	{
		std::cerr << "Error parsing options: " << e.what() << std::endl;
		return 1;
	}

	if (wav_to_tap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to TAP format." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 1 : 0;
						data = (data << 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data << 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (wav_to_oldtap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 0x80 : 0;
						data = (data >> 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data >> 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (tap_to_wav) {
		wave::File write_file;
		std::vector<float> content;	
		wave::Error err = write_file.Open(output_file, wave::kOut);
		if (err) {
			std::cerr << "Something went wrong while opening output file." << std::endl;
			return 1;
		}
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao TAP tape to WAV format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg())-1;
		fs.seekg(1, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		for(uint8_t byte : bytes) {
			for (int j=0;j<8;j++) {
				uint8_t b = (byte >> (7-j)) & 1;
				if (b==0) {
					orao_output_wave(&content, WAVE_LOW , ORAO_WAVE_ZERO);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ZERO);
				} else {
					orao_output_wave(&content, WAVE_LOW,  ORAO_WAVE_ONE);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ONE);
				}
			}
		}
		err = write_file.Write(content);
		if (err) {
			std::cout << "Something went wrong while writing output file." << std::endl;
			return 1;
		}
		return 0;
	}
	if (old_to_new) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao old TAP tape to new TAP format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (int i = ORAO_HEADER_SIZE; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	if (new_to_old) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao new TAP tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (int i = 1; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	return 0;
}